

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreeFindTrees_rec
               (Vec_Int_t *vAdds,Vec_Int_t *vMap,int iObj,int Rank,Vec_Int_t *vTree,
               Vec_Bit_t *vFound)

{
  uint iAdd;
  uint uVar1;
  int iVar2;
  
  if (iObj < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar1 = iObj * 2 + 1;
  if ((int)uVar1 < vMap->nSize) {
    uVar1 = vMap->pArray[uVar1];
    iAdd = vMap->pArray[(uint)(iObj * 2)];
    if ((int)(uVar1 | iAdd) < 0) {
      return;
    }
    iVar2 = Acec_TreeWhichPoint(vAdds,uVar1,iObj);
    Acec_TreeFindTrees2_rec(vAdds,vMap,uVar1,Rank - (uint)(iVar2 == 4),vTree,vFound);
    Acec_TreeFindTrees2_rec(vAdds,vMap,iAdd,Rank,vTree,vFound);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acec_TreeFindTrees_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iObj, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound )
{
    int In  = Vec_IntEntry( vMap, Abc_Var2Lit(iObj, 1) );
    int Out = Vec_IntEntry( vMap, Abc_Var2Lit(iObj, 0) );
    if ( In < 0 || Out < 0 )
        return;
    Acec_TreeFindTrees2_rec( vAdds, vMap, In,  Acec_TreeWhichPoint(vAdds, In, iObj) == 4 ? Rank-1 : Rank, vTree, vFound );
    Acec_TreeFindTrees2_rec( vAdds, vMap, Out, Rank, vTree, vFound );
}